

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.hpp
# Opt level: O0

UniformBufferInfo * __thiscall
Diligent::ShaderResourcesGL::GetUniformBuffer(ShaderResourcesGL *this,Uint32 Index)

{
  Char *Message;
  char (*in_R8) [18];
  undefined1 local_38 [8];
  string msg;
  Uint32 Index_local;
  ShaderResourcesGL *this_local;
  
  msg.field_2._12_4_ = Index;
  if (this->m_NumUniformBuffers <= Index) {
    FormatString<char[23],unsigned_int,char[18]>
              ((string *)local_38,(Diligent *)"Uniform buffer index (",
               (char (*) [23])((long)&msg.field_2 + 0xc),(uint *)") is out of range",in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetUniformBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x132);
    std::__cxx11::string::~string((string *)local_38);
  }
  return this->m_UniformBuffers + (uint)msg.field_2._12_4_;
}

Assistant:

const UniformBufferInfo& GetUniformBuffer(Uint32 Index) const
    {
        VERIFY(Index < m_NumUniformBuffers, "Uniform buffer index (", Index, ") is out of range");
        return m_UniformBuffers[Index];
    }